

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_bounds.h
# Opt level: O3

PreprocessInfoStd * __thiscall
mp::
BoundComputations<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ComputeBoundsAndType<mp::QuadAndLinTerms>
          (PreprocessInfoStd *__return_storage_ptr__,
          BoundComputations<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
          *this,AlgebraicExpression<mp::QuadAndLinTerms> *ae)

{
  double dVar1;
  double dVar2;
  
  ComputeBoundsAndType(__return_storage_ptr__,this,&ae->super_QuadAndLinTerms);
  dVar2 = ae->constant_term_;
  __return_storage_ptr__->lb_ = dVar2 + __return_storage_ptr__->lb_;
  __return_storage_ptr__->ub_ = dVar2 + __return_storage_ptr__->ub_;
  dVar1 = floor(dVar2);
  dVar2 = ceil(dVar2);
  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
    __return_storage_ptr__->type_ = CONTINUOUS;
  }
  return __return_storage_ptr__;
}

Assistant:

PreprocessInfoStd ComputeBoundsAndType(
      const AlgebraicExpression<Body>& ae) const {
    PreprocessInfoStd result
        = ComputeBoundsAndType(ae.GetBody());
    result.lb_ += ae.constant_term();
    result.ub_ += ae.constant_term();
    if (!is_integer(ae.constant_term()))
      result.type_ = var::CONTINUOUS;
    return result;
  }